

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

drwav_uint64
drwav_read_pcm_frames_s32be(drwav *pWav,drwav_uint64 framesToRead,drwav_int32 *pBufferOut)

{
  uint uVar1;
  drwav_uint64 dVar2;
  long lVar3;
  long lVar4;
  
  dVar2 = drwav_read_pcm_frames_s32(pWav,framesToRead,pBufferOut);
  if ((pBufferOut != (drwav_int32 *)0x0) && (lVar3 = dVar2 * pWav->channels, lVar3 != 0)) {
    lVar4 = 0;
    do {
      uVar1 = pBufferOut[lVar4];
      pBufferOut[lVar4] =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      lVar4 = lVar4 + 1;
    } while (lVar3 - lVar4 != 0);
  }
  return dVar2;
}

Assistant:

DRWAV_API drwav_uint64 drwav_read_pcm_frames_s32be(drwav* pWav, drwav_uint64 framesToRead, drwav_int32* pBufferOut)
{
    drwav_uint64 framesRead = drwav_read_pcm_frames_s32(pWav, framesToRead, pBufferOut);
    if (pBufferOut != NULL && drwav__is_little_endian() == DRWAV_TRUE) {
        drwav__bswap_samples_s32(pBufferOut, framesRead*pWav->channels);
    }

    return framesRead;
}